

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O2

void Mvc_CoverDivideByLiteralQuo(Mvc_Cover_t *pCover,int iLit)

{
  int *piVar1;
  Mvc_Cube_t *pMVar2;
  byte bVar3;
  Mvc_Cube_t *pMVar4;
  Mvc_Cube_t *pMVar5;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMVar6;
  
  pCube = (pCover->lCubes).pHead;
  if (pCube == (Mvc_Cube_t *)0x0) {
    pMVar4 = (Mvc_Cube_t *)0x0;
  }
  else {
    pMVar4 = pCube->pNext;
  }
  bVar3 = (byte)iLit & 0x1f;
  pMVar6 = (Mvc_Cube_t *)0x0;
  do {
    pMVar5 = pMVar4;
    if (pCube == (Mvc_Cube_t *)0x0) {
      return;
    }
    if ((pCube->pData[iLit >> 5] & 1 << ((byte)iLit & 0x1f)) == 0) {
      pMVar4 = pMVar6;
      if (pMVar6 == (Mvc_Cube_t *)0x0) {
        pMVar4 = (Mvc_Cube_t *)&pCover->lCubes;
      }
      pMVar2 = pCube->pNext;
      pMVar4->pNext = pMVar2;
      if ((pCover->lCubes).pTail == pCube) {
        if (pMVar2 != (Mvc_Cube_t *)0x0) {
          __assert_fail("pCube->pNext == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mvc/mvcDivide.c"
                        ,0x180,"void Mvc_CoverDivideByLiteralQuo(Mvc_Cover_t *, int)");
        }
        (pCover->lCubes).pTail = pMVar6;
      }
      piVar1 = &(pCover->lCubes).nItems;
      *piVar1 = *piVar1 + -1;
      Mvc_CubeFree(pCover,pCube);
    }
    else {
      pCube->pData[iLit >> 5] =
           pCube->pData[iLit >> 5] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
      pMVar6 = pCube;
    }
    pMVar4 = (Mvc_Cube_t *)0x0;
    pCube = pMVar5;
    if (pMVar5 != (Mvc_Cube_t *)0x0) {
      pMVar4 = pMVar5->pNext;
    }
  } while( true );
}

Assistant:

void Mvc_CoverDivideByLiteralQuo( Mvc_Cover_t * pCover, int iLit )
{
    Mvc_Cube_t * pCube, * pCube2, * pPrev;
    // delete those cubes that do not have this literal
    // remove this literal from other cubes
    pPrev = NULL;
    Mvc_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        if ( Mvc_CubeBitValue( pCube, iLit ) == 0 )
        { // delete the cube from the cover
            Mvc_CoverDeleteCube( pCover, pPrev, pCube );
            Mvc_CubeFree( pCover, pCube );
            // don't update the previous cube
        }
        else
        { // delete this literal from the cube
            Mvc_CubeBitRemove( pCube, iLit );
            // update the previous cube
            pPrev = pCube;
        }
    }
}